

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joynu.c
# Opt level: O0

_Bool al_reconfigure_joysticks(void)

{
  _Bool local_1;
  
  if (new_joystick_driver == (ALLEGRO_JOYSTICK_DRIVER *)0x0) {
    local_1 = false;
  }
  else if (new_joystick_driver->reconfigure_joysticks == (_func__Bool *)0x0) {
    (*new_joystick_driver->num_joysticks)();
    local_1 = true;
  }
  else {
    local_1 = (*new_joystick_driver->reconfigure_joysticks)();
  }
  return local_1;
}

Assistant:

bool al_reconfigure_joysticks(void)
{
   if (!new_joystick_driver)
      return false;

   /* XXX only until Windows and Mac joystick drivers are updated */
   if (!new_joystick_driver->reconfigure_joysticks) {
      new_joystick_driver->num_joysticks();
      return true;
   }

   return new_joystick_driver->reconfigure_joysticks();
}